

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O0

gme_err_t gme_open_data(void *data,long size,Music_Emu **out,int sample_rate)

{
  Music_Emu *pMVar1;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  Music_Emu *unaff_retaddr;
  gme_err_t err;
  Music_Emu *emu;
  gme_type_t file_type;
  void *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc8;
  gme_type_t local_30;
  gme_type_t in_stack_fffffffffffffff8;
  char *pcVar2;
  
  *in_RDX = 0;
  local_30 = (gme_type_t)0x0;
  if (3 < in_RSI) {
    gme_identify_header(in_stack_ffffffffffffffb8);
    local_30 = gme_identify_extension(in_stack_ffffffffffffffc8);
  }
  if (local_30 == (gme_type_t)0x0) {
    pcVar2 = "Wrong file type for this emulator";
  }
  else {
    pMVar1 = gme_new_emu(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
    if (pMVar1 == (Music_Emu *)0x0) {
      pcVar2 = "Out of memory";
    }
    else {
      pcVar2 = gme_load_data(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
      if (pcVar2 == (gme_err_t)0x0) {
        *in_RDX = pMVar1;
      }
      else if (pMVar1 != (Music_Emu *)0x0) {
        (*(pMVar1->super_Gme_File)._vptr_Gme_File[1])();
      }
    }
  }
  return pcVar2;
}

Assistant:

BLARGG_EXPORT gme_err_t gme_open_data( void const* data, long size, Music_Emu** out, int sample_rate )
{
	require( (data || !size) && out );
	*out = 0;
	
	gme_type_t file_type = 0;
	if ( size >= 4 )
		file_type = gme_identify_extension( gme_identify_header( data ) );
	if ( !file_type )
		return gme_wrong_file_type;
	
	Music_Emu* emu = gme_new_emu( file_type, sample_rate );
	CHECK_ALLOC( emu );
	
	gme_err_t err = gme_load_data( emu, data, size );
	
	if ( err )
		delete emu;
	else
		*out = emu;
	
	return err;
}